

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectSeq_rec(Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vObjs)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObjs_local;
  Vec_Int_t *vRoots_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pGVar2 = Gia_ManObj(p,Id);
    iVar1 = Gia_ObjIsAnd(pGVar2);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGVar2);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGVar2);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaDfs.c"
                        ,0x1d4,
                        "void Gia_ManCollectSeq_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
        }
        iVar1 = Gia_ObjFaninId0(pGVar2,Id);
        Gia_ManCollectSeq_rec(p,iVar1,vRoots,vObjs);
      }
      else {
        iVar1 = Gia_ObjIsRo(p,pGVar2);
        if (iVar1 != 0) {
          pGVar2 = Gia_ObjRoToRi(p,pGVar2);
          iVar1 = Gia_ObjId(p,pGVar2);
          Vec_IntPush(vRoots,iVar1);
        }
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0(pGVar2,Id);
      Gia_ManCollectSeq_rec(p,iVar1,vRoots,vObjs);
      iVar1 = Gia_ObjFaninId1(pGVar2,Id);
      Gia_ManCollectSeq_rec(p,iVar1,vRoots,vObjs);
    }
    Vec_IntPush(vObjs,Id);
  }
  return;
}

Assistant:

void Gia_ManCollectSeq_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, Id );
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vObjs );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
    else assert( 0 );
    Vec_IntPush( vObjs, Id );
}